

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

const_iterator * __thiscall
compressed_sparse_matrix<filtration_entry_t>::cbegin
          (const_iterator *__return_storage_ptr__,compressed_sparse_matrix<filtration_entry_t> *this
          ,size_t index)

{
  _Map_pointer ppuVar1;
  _Map_pointer ppuVar2;
  _Elt_pointer puVar3;
  unsigned_long __n;
  _Elt_pointer pfVar4;
  _Elt_pointer pfVar5;
  _Map_pointer ppfVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  ulong uVar9;
  _Self *__tmp;
  
  ppuVar1 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppuVar2 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar3 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if (((long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_start._M_last - (long)puVar3 >> 3) +
      ((long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur -
       (long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)ppuVar1 - (long)ppuVar2) >> 3) - 1) + (ulong)(ppuVar1 == (_Map_pointer)0x0))
      * 0x40 <= index) {
    __assert_fail("index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JasonPSmith[P]tournser/pytournser/../tournser.cpp"
                  ,0xaa,
                  "typename std::deque<ValueType>::const_iterator compressed_sparse_matrix<filtration_entry_t>::cbegin(size_t) const [ValueType = filtration_entry_t]"
                 );
  }
  if (index == 0) {
    pfVar4 = (this->entries).
             super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
    __return_storage_ptr__->_M_cur =
         (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur;
    __return_storage_ptr__->_M_first = pfVar4;
    ppfVar6 = (this->entries).
              super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    __return_storage_ptr__->_M_last =
         (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
         _M_impl.super__Deque_impl_data._M_start._M_last;
    __return_storage_ptr__->_M_node = ppfVar6;
    return __return_storage_ptr__;
  }
  pfVar4 = (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
  pfVar5 = (this->entries).
           super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  ppfVar6 = (this->entries).
            super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  uVar7 = ((long)puVar3 -
           (long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + (index - 1);
  if ((long)uVar7 < 0) {
    uVar9 = (long)uVar7 >> 6;
  }
  else {
    if (uVar7 < 0x40) {
      puVar8 = puVar3 + (index - 1);
      goto LAB_0011f063;
    }
    uVar9 = uVar7 >> 6;
  }
  puVar8 = ppuVar2[uVar9] + uVar7 + uVar9 * -0x40;
LAB_0011f063:
  __n = *puVar8;
  __return_storage_ptr__->_M_cur =
       (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
       _M_impl.super__Deque_impl_data._M_start._M_cur;
  __return_storage_ptr__->_M_first = pfVar4;
  __return_storage_ptr__->_M_last = pfVar5;
  __return_storage_ptr__->_M_node = ppfVar6;
  std::_Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>::
  operator+=(__return_storage_ptr__,__n);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<ValueType>::const_iterator cbegin(size_t index) const {
		assert(index < size());
		return index == 0 ? entries.cbegin() : entries.cbegin() + bounds[index - 1];
	}